

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void __thiscall FMapInfoParser::ParseMapDefinition(FMapInfoParser *this,level_info_t *info)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FAutoSegIterator *this_00;
  NCREGINFO pvVar4;
  undefined8 *puVar5;
  undefined1 local_48 [7];
  bool success;
  FAutoSegIterator probe;
  int set;
  MapInfoFlagHandler *handler;
  int index;
  level_info_t *info_local;
  FMapInfoParser *this_local;
  
  ParseOpenBrace(this);
  while (bVar1 = FScanner::GetString(&this->sc), bVar1) {
    iVar3 = FScanner::MatchString(&this->sc,&MapFlagHandlers[0].name,0x18);
    if (iVar3 < 0) {
      FAutoSegIterator::FAutoSegIterator((FAutoSegIterator *)local_48,&YRegHead,&YRegTail);
      bVar1 = false;
      do {
        this_00 = FAutoSegIterator::operator++((FAutoSegIterator *)local_48);
        pvVar4 = FAutoSegIterator::operator*(this_00);
        if (pvVar4 == (NCREGINFO)0x0) goto LAB_005d5663;
        puVar5 = (undefined8 *)FAutoSegIterator::operator*((FAutoSegIterator *)local_48);
        bVar2 = FScanner::Compare(&this->sc,(char *)*puVar5);
      } while (!bVar2);
      pvVar4 = FAutoSegIterator::operator*((FAutoSegIterator *)local_48);
      if (((*(byte *)((long)pvVar4 + 0x10) & 1) == 0) && (this->format_type != 2)) {
        FScanner::ScriptError
                  (&this->sc,"MAPINFO option \'%s\' requires the new MAPINFO format",
                   (this->sc).String);
      }
      pvVar4 = FAutoSegIterator::operator*((FAutoSegIterator *)local_48);
      (**(code **)((long)pvVar4 + 8))(this,info);
      bVar1 = true;
LAB_005d5663:
      if (!bVar1) {
        bVar1 = ParseCloseBrace(this);
        if (bVar1) break;
        FScanner::ScriptMessage
                  (&this->sc,"Unknown property \'%s\' found in map definition\n",(this->sc).String);
        SkipToNext(this);
      }
    }
    else {
      switch(MapFlagHandlers[iVar3].type) {
      case MITYPE_IGNORE:
        break;
      case MITYPE_EATNEXT:
        ParseAssign(this);
        FScanner::MustGetString(&this->sc);
        break;
      case MITYPE_SETFLAG:
        info->flags = MapFlagHandlers[iVar3].data1 | info->flags;
        info->flags = MapFlagHandlers[iVar3].data2 | info->flags;
        break;
      case MITYPE_CLRFLAG:
        info->flags = (MapFlagHandlers[iVar3].data1 ^ 0xffffffff) & info->flags;
        info->flags = MapFlagHandlers[iVar3].data2 | info->flags;
        break;
      case MITYPE_SCFLAGS:
        info->flags = info->flags & MapFlagHandlers[iVar3].data2 | MapFlagHandlers[iVar3].data1;
        break;
      case MITYPE_SETFLAG2:
        info->flags2 = MapFlagHandlers[iVar3].data1 | info->flags2;
        info->flags2 = MapFlagHandlers[iVar3].data2 | info->flags2;
        break;
      case MITYPE_CLRFLAG2:
        info->flags2 = (MapFlagHandlers[iVar3].data1 ^ 0xffffffff) & info->flags2;
        info->flags2 = MapFlagHandlers[iVar3].data2 | info->flags2;
        break;
      case MITYPE_SCFLAGS2:
        info->flags2 = info->flags2 & MapFlagHandlers[iVar3].data2 | MapFlagHandlers[iVar3].data1;
        break;
      case MITYPE_SETFLAG3:
        info->flags3 = MapFlagHandlers[iVar3].data1 | info->flags3;
        info->flags3 = MapFlagHandlers[iVar3].data2 | info->flags3;
        break;
      case MITYPE_CLRFLAG3:
        info->flags3 = (MapFlagHandlers[iVar3].data1 ^ 0xffffffff) & info->flags3;
        info->flags3 = MapFlagHandlers[iVar3].data2 | info->flags3;
        break;
      case MITYPE_SCFLAGS3:
        info->flags3 = info->flags3 & MapFlagHandlers[iVar3].data2 | MapFlagHandlers[iVar3].data1;
        break;
      case MITYPE_COMPATFLAG:
        probe.Tail._4_4_ = 1;
        if (this->format_type == 2) {
          bVar1 = CheckAssign(this);
          if (bVar1) {
            FScanner::MustGetNumber(&this->sc);
            probe.Tail._4_4_ = (this->sc).Number;
          }
        }
        else {
          bVar1 = FScanner::CheckNumber(&this->sc);
          if (bVar1) {
            probe.Tail._4_4_ = (this->sc).Number;
          }
        }
        if (probe.Tail._4_4_ == 0) {
          info->compatflags = (MapFlagHandlers[iVar3].data1 ^ 0xffffffff) & info->compatflags;
          info->compatflags2 = (MapFlagHandlers[iVar3].data2 ^ 0xffffffff) & info->compatflags2;
        }
        else {
          info->compatflags = MapFlagHandlers[iVar3].data1 | info->compatflags;
          info->compatflags2 = MapFlagHandlers[iVar3].data2 | info->compatflags2;
        }
        info->compatmask = MapFlagHandlers[iVar3].data1 | info->compatmask;
        info->compatmask2 = MapFlagHandlers[iVar3].data2 | info->compatmask2;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_mapinfo.cpp"
                      ,0x5b2,"void FMapInfoParser::ParseMapDefinition(level_info_t &)");
      }
    }
  }
  CheckEndOfFile(this,"map");
  return;
}

Assistant:

void FMapInfoParser::ParseMapDefinition(level_info_t &info)
{
	int index;

	ParseOpenBrace();

	while (sc.GetString())
	{
		if ((index = sc.MatchString(&MapFlagHandlers->name, sizeof(*MapFlagHandlers))) >= 0)
		{
			MapInfoFlagHandler *handler = &MapFlagHandlers[index];
			switch (handler->type)
			{
			case MITYPE_EATNEXT:
				ParseAssign();
				sc.MustGetString();
				break;

			case MITYPE_IGNORE:
				break;

			case MITYPE_SETFLAG:
				info.flags |= handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_CLRFLAG:
				info.flags &= ~handler->data1;
				info.flags |= handler->data2;
				break;

			case MITYPE_SCFLAGS:
				info.flags = (info.flags & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG2:
				info.flags2 |= handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_CLRFLAG2:
				info.flags2 &= ~handler->data1;
				info.flags2 |= handler->data2;
				break;

			case MITYPE_SCFLAGS2:
				info.flags2 = (info.flags2 & handler->data2) | handler->data1;
				break;

			case MITYPE_SETFLAG3:
				info.flags3 |= handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_CLRFLAG3:
				info.flags3 &= ~handler->data1;
				info.flags3 |= handler->data2;
				break;

			case MITYPE_SCFLAGS3:
				info.flags3 = (info.flags3 & handler->data2) | handler->data1;
				break;

			case MITYPE_COMPATFLAG:
			{
				int set = 1;
				if (format_type == FMT_New)
				{
					if (CheckAssign())
					{
						sc.MustGetNumber();
						set = sc.Number;
					}
				}
				else
				{
					if (sc.CheckNumber()) set = sc.Number;
				}

				if (set)
				{
					info.compatflags |= handler->data1;
					info.compatflags2 |= handler->data2;
				}
				else
				{
					info.compatflags &= ~handler->data1;
					info.compatflags2 &= ~handler->data2;
				}
				info.compatmask |= handler->data1;
				info.compatmask2 |= handler->data2;
			}
			break;

			default:
				// should never happen
				assert(false);
				break;
			}
		}
		else
		{
			FAutoSegIterator probe(YRegHead, YRegTail);
			bool success = false;

			while (*++probe != NULL)
			{
				if (sc.Compare(((FMapOptInfo *)(*probe))->name))
				{
					if (!((FMapOptInfo *)(*probe))->old && format_type != FMT_New)
					{
						sc.ScriptError("MAPINFO option '%s' requires the new MAPINFO format", sc.String);
					}
					((FMapOptInfo *)(*probe))->handler(*this, &info);
					success = true;
					break;
				}
			}

			if (!success)
			{
				if (!ParseCloseBrace())
				{
					// Unknown
					sc.ScriptMessage("Unknown property '%s' found in map definition\n", sc.String);
					SkipToNext();
				}
				else
				{
					break;
				}
			}
		}
	}
	CheckEndOfFile("map");
}